

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O3

void __thiscall
helics::apps::Echo::loadJsonFile
          (Echo *this,string *jsonFile,bool enableFederateInterfaceRegistration)

{
  int iVar1;
  Endpoint *__args;
  const_iterator cVar2;
  reference pvVar3;
  Time TVar4;
  _Elt_pointer pEVar5;
  int index;
  json doc;
  value_type echoConfig;
  _Any_data local_68;
  undefined1 local_58 [16];
  data local_48;
  _Alloc_hider local_38;
  
  local_68._M_unused._M_object = (Echo *)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"echo","");
  apps::App::loadJsonFileConfiguration
            (&this->super_App,(string *)&local_68,jsonFile,enableFederateInterfaceRegistration);
  if ((Echo *)local_68._M_unused._0_8_ != (Echo *)local_58) {
    operator_delete(local_68._M_unused._M_object,(ulong)(local_58._0_8_ + 1));
  }
  local_38._M_p = (pointer)jsonFile;
  iVar1 = helics::MessageFederate::getEndpointCount
                    ((MessageFederate *)
                     &(((this->super_App).fed.
                        super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_ValueFederate).field_0x10);
  if (0 < iVar1) {
    index = 0;
    do {
      __args = helics::MessageFederate::getEndpoint
                         ((MessageFederate *)
                          &(((this->super_App).fed.
                             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_ValueFederate).field_0x10,index);
      std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::emplace_back<helics::Endpoint&>
                ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,__args
                );
      pEVar5 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pEVar5 == (this->endpoints).
                    super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pEVar5 = (this->endpoints).
                 super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 4;
      }
      local_68._8_8_ =
           (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
            *)0x0;
      local_58._8_8_ =
           CLI::std::
           _Function_handler<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Echo.cpp:144:17)>
           ::_M_invoke;
      local_58._0_8_ =
           CLI::std::
           _Function_handler<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Echo.cpp:144:17)>
           ::_M_manager;
      local_68._M_unused._M_object = this;
      Endpoint::setCallback
                (pEVar5 + -1,
                 (function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
                  *)&local_68);
      if ((_func_int **)local_58._0_8_ != (_func_int **)0x0) {
        (*(code *)local_58._0_8_)(&local_68,&local_68,3);
      }
      index = index + 1;
    } while (iVar1 != index);
  }
  fileops::loadJson((fileops *)local_68._M_pod_data,(string *)local_38._M_p);
  if (local_68._M_pod_data[0] == '\x01') {
    cVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
            ::_M_find_tr<char[5],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        *)local_68._8_8_,(char (*) [5])"echo");
    if (cVar2._M_node != (_Base_ptr)(local_68._8_8_ + 8)) {
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)local_68._M_pod_data,"echo");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_48,pvVar3);
      if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           )local_48.m_type ==
          (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           )0x1) {
        cVar2 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                ::_M_find_tr<char[6],void>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                            *)local_48.m_value.object,(char (*) [6])0x43a9db);
        if ((_Rb_tree_header *)cVar2._M_node !=
            &((local_48.m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
          iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->delayTimeLock);
          if (iVar1 != 0) {
            std::__throw_system_error(iVar1);
          }
          pvVar3 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&local_48,"delay");
          TVar4 = fileops::loadJsonTime(pvVar3,sec);
          (this->delayTime).internalTimeCode = TVar4.internalTimeCode;
          pthread_mutex_unlock((pthread_mutex_t *)&this->delayTimeLock);
        }
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_48);
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)&local_68);
  return;
}

Assistant:

void Echo::loadJsonFile(const std::string& jsonFile, bool enableFederateInterfaceRegistration)
    {
        loadJsonFileConfiguration("echo", jsonFile, enableFederateInterfaceRegistration);
        auto eptCount = fed->getEndpointCount();
        for (int ii = 0; ii < eptCount; ++ii) {
            endpoints.emplace_back(fed->getEndpoint(ii));
            endpoints.back().setCallback(
                [this](const Endpoint& ept, Time messageTime) { echoMessage(ept, messageTime); });
        }

        auto doc = fileops::loadJson(jsonFile);

        if (doc.contains("echo")) {
            auto echoConfig = doc["echo"];

            if (echoConfig.contains("delay")) {
                std::lock_guard<std::mutex> lock(delayTimeLock);
                delayTime = fileops::loadJsonTime(echoConfig["delay"]);
            }
        }
    }